

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O3

TestNode * __thiscall xe::TestNode::find(TestNode *this,char *path)

{
  char cVar1;
  pointer pcVar2;
  TestNode *pTVar3;
  Error *this_00;
  int compLen;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (this->m_nodeType == TESTNODETYPE_ROOT) {
LAB_0012533b:
    pTVar3 = TestGroup::findChildNode((TestGroup *)this,path);
    return pTVar3;
  }
  uVar5 = 0;
  while( true ) {
    iVar4 = (int)uVar5;
    cVar1 = path[iVar4];
    if ((cVar1 == '\0') || (cVar1 == '.')) break;
    uVar5 = (ulong)(iVar4 + 1);
  }
  if (iVar4 < 1) {
    this_00 = (Error *)__cxa_allocate_exception(0x10);
    Error::Error(this_00,(char *)0x0,"compLen > 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTestCase.cpp"
                 ,0x9d);
    __cxa_throw(this_00,&Error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar2 = (this->m_name)._M_dataplus._M_p;
  uVar6 = 0;
  do {
    if (pcVar2[uVar6] != path[uVar6]) {
      return (TestNode *)0x0;
    }
    uVar6 = uVar6 + 1;
  } while (uVar5 != uVar6);
  if (pcVar2[iVar4] == '\0') {
    if (cVar1 == '\0') {
      return this;
    }
    if (this->m_nodeType == TESTNODETYPE_GROUP) {
      path = path + uVar5 + 1;
      goto LAB_0012533b;
    }
  }
  return (TestNode *)0x0;
}

Assistant:

const TestNode* TestNode::find (const char* path) const
{
	if (m_nodeType == TESTNODETYPE_ROOT)
	{
		// Don't need to consider current node.
		return static_cast<const TestGroup*>(this)->findChildNode(path);
	}
	else
	{
		// Check if first component matches this node.
		int compLen = getFirstComponentLength(path);
		XE_CHECK(compLen > 0);

		if (compareNameToPathComponent(getName(), path, compLen))
		{
			if (path[compLen] == 0)
				return this;
			else if (getNodeType() == TESTNODETYPE_GROUP)
				return static_cast<const TestGroup*>(this)->findChildNode(path + compLen + 1);
			else
				return DE_NULL;
		}
		else
			return DE_NULL;
	}
}